

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O1

void __thiscall UEFITool::scrollTreeView(UEFITool *this,QListWidgetItem *item)

{
  long *plVar1;
  QByteArray second;
  QArrayData *local_48;
  int *local_40;
  AllocationOption local_38;
  QVariant local_30;
  
  (**(code **)(*(long *)item + 0x18))(&local_30,item,0x100);
  QVariant::toByteArray();
  QVariant::~QVariant(&local_30);
  if ((local_48 == (QArrayData *)0x0) ||
     (1 < (local_48->ref_)._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_48,local_38);
  }
  if ((((local_40 != (int *)0x0) && (-1 < *local_40)) && (-1 < local_40[1])) &&
     (*(long *)(local_40 + 4) != 0)) {
    (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),local_40,3);
    plVar1 = (long *)QAbstractItemView::selectionModel();
    (**(code **)(*plVar1 + 0x68))(plVar1,local_40,0x23);
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,8);
    }
  }
  return;
}

Assistant:

void UEFITool::scrollTreeView(QListWidgetItem* item)
{
    QByteArray second = item->data(Qt::UserRole).toByteArray();
    QModelIndex *index = (QModelIndex *)second.data();
    if (index && index->isValid()) {
        ui->structureTreeView->scrollTo(*index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(*index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}